

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O3

string * __thiscall
absl::BytesToHexString_abi_cxx11_(string *__return_storage_ptr__,absl *this,string_view from)

{
  pointer pcVar1;
  absl *paVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)this * '\x02');
  if (this != (absl *)0x0) {
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    paVar2 = (absl *)0x0;
    do {
      *(undefined2 *)(pcVar1 + (long)paVar2 * 2) =
           *(undefined2 *)(numbers_internal::kHexTable + (ulong)(byte)paVar2[from._M_len] * 2);
      paVar2 = paVar2 + 1;
    } while (this != paVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BytesToHexString(absl::string_view from) {
  std::string result;
  strings_internal::STLStringResizeUninitialized(&result, 2 * from.size());
  absl::BytesToHexStringInternal<std::string&>(
      reinterpret_cast<const unsigned char*>(from.data()), result, from.size());
  return result;
}